

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::anon_unknown_0::AbsCaseInstance::getInputValues
          (AbsCaseInstance *this,int numValues,void **values)

{
  float fVar1;
  float fVar2;
  DataType dataType;
  int iVar3;
  pointer pSVar4;
  void *pvVar5;
  deUint32 dVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  float *typedPtr;
  float fVar10;
  Random rnd;
  deRandom local_78;
  int local_68 [8];
  float local_48 [6];
  
  local_48[0] = -2.0;
  local_48[1] = 2.0;
  local_48[2] = -1000.0;
  local_48[3] = 1000.0;
  local_48[4] = -1e+07;
  local_48[5] = 1e+07;
  local_68[0] = -0x7f;
  local_68[1] = 0x7f;
  local_68[2] = -0x7fff;
  local_68[3] = 0x7fff;
  local_68[4] = -0x7fffffff;
  local_68[5] = 0x7fffffff;
  dVar6 = deStringHash((this->super_CommonFunctionTestInstance).m_name);
  deRandom_init(&local_78,dVar6 ^ 0x235fac);
  pSVar4 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dataType = (pSVar4->varType).m_data.basic.type;
  uVar9 = (ulong)*(uint *)((long)&(pSVar4->varType).m_data + 4);
  iVar7 = glu::getDataTypeScalarSize(dataType);
  uVar8 = iVar7 * numValues;
  pvVar5 = *values;
  if (dataType - TYPE_FLOAT < 4) {
    if (0 < (int)uVar8) {
      fVar1 = local_48[uVar9 * 2];
      fVar2 = local_48[uVar9 * 2 + 1];
      uVar9 = 0;
      do {
        fVar10 = deRandom_getFloat(&local_78);
        *(float *)((long)pvVar5 + uVar9 * 4) = fVar10 * (fVar2 - fVar1) + fVar1;
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
  }
  else if (0 < (int)uVar8) {
    iVar7 = local_68[uVar9 * 2];
    iVar3 = local_68[uVar9 * 2 + 1];
    uVar9 = 0;
    do {
      dVar6 = deRandom_getUint32(&local_78);
      if (iVar3 != 0x7fffffff || iVar7 != -0x80000000) {
        dVar6 = dVar6 % ((iVar3 - iVar7) + 1U) + iVar7;
      }
      *(deUint32 *)((long)pvVar5 + uVar9 * 4) = dVar6;
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 floatRanges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e3f,		1e3f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};
		const IVec2 intRanges[] =
		{
			IVec2(-(1<<7)+1,	(1<<7)-1),
			IVec2(-(1<<15)+1,	(1<<15)-1),
			IVec2(0x80000001,	0x7fffffff)
		};

		de::Random				rnd			(deStringHash(m_name) ^ 0x235facu);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize	= glu::getDataTypeScalarSize(type);

		if (glu::isDataTypeFloatOrVec(type))
			fillRandomScalars(rnd, floatRanges[precision].x(), floatRanges[precision].y(), values[0], numValues*scalarSize);
		else
			fillRandomScalars(rnd, intRanges[precision].x(), intRanges[precision].y(), values[0], numValues*scalarSize);
	}